

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall deqp::gles31::Functional::IsnanCase::~IsnanCase(IsnanCase *this)

{
  CommonFunctionCase::~CommonFunctionCase(&this->super_CommonFunctionCase);
  operator_delete(this,0x280);
  return;
}

Assistant:

IsnanCase (Context& context, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: CommonFunctionCase(context, getCommonFuncCaseName(baseType, precision, shaderType).c_str(), "isnan", shaderType)
	{
		DE_ASSERT(glu::isDataTypeFloatOrVec(baseType));

		const int			vecSize		= glu::getDataTypeScalarSize(baseType);
		const glu::DataType	boolType	= vecSize > 1 ? glu::getDataTypeBoolVec(vecSize) : glu::TYPE_BOOL;

		m_spec.inputs.push_back(Symbol("in0", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(boolType, glu::PRECISION_LAST)));
		m_spec.source = "out0 = isnan(in0);";
	}